

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditLimitCalculator.c
# Opt level: O3

int main(void)

{
  float fVar1;
  float creditLimit;
  int accountNumber;
  float totalCredits;
  float totalCharges;
  float beginningBalance;
  float local_48;
  uint local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_44 = 0;
  local_38 = 0.0;
  local_3c = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  printf("%s","Enter account number (-1 to end): ");
  __isoc99_scanf("%d",&local_44);
  if (local_44 != 0xffffffff) {
    do {
      printf("%s","Enter beginning balance: ");
      __isoc99_scanf("%f",&local_38);
      printf("%s","Enter total charges: ");
      __isoc99_scanf("%f",&local_3c);
      printf("%s","Enter total credits: ");
      __isoc99_scanf("%f",&local_40);
      printf("%s","Enter credit limit: ");
      __isoc99_scanf("%f",&local_48);
      fVar1 = (local_38 + local_3c) - local_40;
      if (local_48 < fVar1) {
        local_34 = fVar1;
        printf("%s %d\n","Account:      ",(ulong)local_44);
        printf("%s %0.2f\n",(double)local_48,"Credit limit: ");
        printf("%s %0.2f\n",(double)local_34,"Balance:      ");
        printf("%s\n\n","Credit Limit Exceeded.\n");
      }
      printf("\n%s","Enter account number (-1 to end): ");
      __isoc99_scanf("%d",&local_44);
    } while (local_44 != 0xffffffff);
  }
  return 0;
}

Assistant:

int main (void) {
    int accountNumber = 0;
    float beginningBalance = 0.0;
    float finalBalance;
    float totalCharges = 0.0;
    float totalCredits = 0.0;
    float creditLimit = 0.0;

    printf("%s", "Enter account number (-1 to end): ");
    scanf("%d", &accountNumber);
    while (accountNumber != -1) {
        printf("%s", "Enter beginning balance: ");
        scanf("%f", &beginningBalance);
        printf("%s", "Enter total charges: ");
        scanf("%f", &totalCharges);
        printf("%s", "Enter total credits: ");
        scanf("%f", &totalCredits);
        printf("%s", "Enter credit limit: ");
        scanf("%f", &creditLimit);

        finalBalance = (beginningBalance + totalCharges) - totalCredits;

        if (finalBalance > creditLimit) {
            printf("%s %d\n", "Account:      ", accountNumber);
            printf("%s %0.2f\n", "Credit limit: ", creditLimit);
            printf("%s %0.2f\n", "Balance:      ", finalBalance);
            printf("%s\n\n", "Credit Limit Exceeded.\n");
        }


        printf("\n%s", "Enter account number (-1 to end): ");
        scanf("%d", &accountNumber);

    }

    return 0;

}